

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

char * target_parse_constraint(TCGArgConstraint *ct,char *ct_str,TCGType_conflict type)

{
  ushort uVar1;
  TCGType_conflict type_local;
  char *ct_str_local;
  TCGArgConstraint *ct_local;
  
  ct_local = (TCGArgConstraint *)(ct_str + 1);
  switch(*ct_str) {
  case 'D':
    ct->ct = ct->ct | 1;
    (ct->u).regs = (ct->u).regs | 0x80;
    break;
  default:
    ct_local = (TCGArgConstraint *)0x0;
    break;
  case 'I':
    uVar1 = 0x400;
    if (type == TCG_TYPE_I32) {
      uVar1 = 2;
    }
    ct->ct = ct->ct | uVar1;
    break;
  case 'L':
    ct->ct = ct->ct | 1;
    (ct->u).regs = 0xffff;
    (ct->u).regs = (ct->u).regs & 0xffffff7f;
    (ct->u).regs = (ct->u).regs & 0xffffffbf;
    break;
  case 'Q':
    ct->ct = ct->ct | 1;
    (ct->u).regs = 0xf;
    break;
  case 'S':
    ct->ct = ct->ct | 1;
    (ct->u).regs = (ct->u).regs | 0x40;
    break;
  case 'W':
    ct->ct = ct->ct | 0x800;
    break;
  case 'Z':
    uVar1 = 0x200;
    if (type == TCG_TYPE_I32) {
      uVar1 = 2;
    }
    ct->ct = ct->ct | uVar1;
    break;
  case 'a':
    ct->ct = ct->ct | 1;
    (ct->u).regs = (ct->u).regs | 1;
    break;
  case 'b':
    ct->ct = ct->ct | 1;
    (ct->u).regs = (ct->u).regs | 8;
    break;
  case 'c':
    ct->ct = ct->ct | 1;
    (ct->u).regs = (ct->u).regs | 2;
    break;
  case 'd':
    ct->ct = ct->ct | 1;
    (ct->u).regs = (ct->u).regs | 4;
    break;
  case 'e':
    uVar1 = 0x100;
    if (type == TCG_TYPE_I32) {
      uVar1 = 2;
    }
    ct->ct = ct->ct | uVar1;
    break;
  case 'q':
    ct->ct = ct->ct | 1;
    (ct->u).regs = 0xffff;
    break;
  case 'r':
    ct->ct = ct->ct | 1;
    (ct->u).regs = (ct->u).regs | 0xffff;
    break;
  case 'x':
    ct->ct = ct->ct | 1;
    (ct->u).regs = (ct->u).regs | 0xffff0000;
  }
  return (char *)ct_local;
}

Assistant:

static const char *target_parse_constraint(TCGArgConstraint *ct,
                                           const char *ct_str, TCGType type)
{
    switch(*ct_str++) {
    case 'a':
        ct->ct |= TCG_CT_REG;
        tcg_regset_set_reg(ct->u.regs, TCG_REG_EAX);
        break;
    case 'b':
        ct->ct |= TCG_CT_REG;
        tcg_regset_set_reg(ct->u.regs, TCG_REG_EBX);
        break;
    case 'c':
        ct->ct |= TCG_CT_REG;
        tcg_regset_set_reg(ct->u.regs, TCG_REG_ECX);
        break;
    case 'd':
        ct->ct |= TCG_CT_REG;
        tcg_regset_set_reg(ct->u.regs, TCG_REG_EDX);
        break;
    case 'S':
        ct->ct |= TCG_CT_REG;
        tcg_regset_set_reg(ct->u.regs, TCG_REG_ESI);
        break;
    case 'D':
        ct->ct |= TCG_CT_REG;
        tcg_regset_set_reg(ct->u.regs, TCG_REG_EDI);
        break;
    case 'q':
        /* A register that can be used as a byte operand.  */
        ct->ct |= TCG_CT_REG;
        ct->u.regs = TCG_TARGET_REG_BITS == 64 ? 0xffff : 0xf;
        break;
    case 'Q':
        /* A register with an addressable second byte (e.g. %ah).  */
        ct->ct |= TCG_CT_REG;
        ct->u.regs = 0xf;
        break;
    case 'r':
        /* A general register.  */
        ct->ct |= TCG_CT_REG;
        ct->u.regs |= ALL_GENERAL_REGS;
        break;
    case 'W':
        /* With TZCNT/LZCNT, we can have operand-size as an input.  */
        ct->ct |= TCG_CT_CONST_WSZ;
        break;
    case 'x':
        /* A vector register.  */
        ct->ct |= TCG_CT_REG;
        ct->u.regs |= ALL_VECTOR_REGS;
        break;

        /* qemu_ld/st address constraint */
    case 'L':
        ct->ct |= TCG_CT_REG;
        ct->u.regs = TCG_TARGET_REG_BITS == 64 ? 0xffff : 0xff;
        tcg_regset_reset_reg(ct->u.regs, TCG_REG_L0);
        tcg_regset_reset_reg(ct->u.regs, TCG_REG_L1);
        break;

    case 'e':
        ct->ct |= (type == TCG_TYPE_I32 ? TCG_CT_CONST : TCG_CT_CONST_S32);
        break;
    case 'Z':
        ct->ct |= (type == TCG_TYPE_I32 ? TCG_CT_CONST : TCG_CT_CONST_U32);
        break;
    case 'I':
        ct->ct |= (type == TCG_TYPE_I32 ? TCG_CT_CONST : TCG_CT_CONST_I32);
        break;

    default:
        return NULL;
    }
    return ct_str;
}